

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O3

expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
tinyusdz::tydra::(anonymous_namespace)::UniformToFaceVarying_abi_cxx11_
          (expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *src,size_t stride_bytes,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexCounts)

{
  pointer *ppuVar1;
  uint uVar2;
  expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX;
  long lVar3;
  expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX_00;
  expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *peVar4;
  expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX_01;
  ulong uVar5;
  ulong uVar6;
  undefined8 uVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dst;
  size_t num_uniforms;
  undefined1 local_c8 [16];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_78;
  undefined1 local_70 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  long local_50 [2];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_40;
  unsigned_long local_38;
  
  local_98._16_8_ = (long *)0x0;
  local_98._24_8_ = 0;
  local_78 = (expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x0;
  local_40 = src;
  if (src == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
    local_c8._0_8_ = "stride_bytes is zero.";
    nonstd::expected_lite::
    expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,(unexpected_type<const_char_*> *)local_c8);
    return extraout_RAX;
  }
  local_70._0_8_ = (ulong)(*(long *)(this + 8) - *(long *)this) / (ulong)src;
  if ((ulong)(*(long *)(this + 8) - *(long *)this) % (ulong)src == 0) {
    if ((pointer)local_70._0_8_ ==
        (pointer)(*(long *)(stride_bytes + 8) - *(long *)stride_bytes >> 2)) {
      local_c8._0_8_ =
           (expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x0;
      local_c8._8_8_ = (pointer)0x0;
      local_b8._0_8_ = (pointer)0x0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8,(size_type)src);
      lVar3 = *(long *)stride_bytes;
      if (*(long *)(stride_bytes + 8) == lVar3) {
        peVar4 = (expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x0;
        local_98._16_4_ = 0;
        local_98._20_4_ = 0;
        local_98._24_4_ = 0;
        local_98._28_4_ = 0;
      }
      else {
        uVar6 = 0;
        local_70._8_8_ = __return_storage_ptr__;
        do {
          uVar2 = *(uint *)(lVar3 + uVar6 * 4);
          memcpy((void *)local_c8._0_8_,(void *)(uVar6 * (long)src + *(long *)this),(size_t)src);
          peVar4 = local_78;
          __return_storage_ptr__ =
               (expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_70._8_8_;
          for (uVar5 = (ulong)uVar2; local_78 = peVar4, local_70._8_8_ = __return_storage_ptr__,
              uVar5 != 0; uVar5 = uVar5 - 1) {
            ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)(local_98 + 0x10),
                       local_98._24_8_,local_c8._0_8_,local_c8._8_8_);
            peVar4 = local_78;
            __return_storage_ptr__ =
                 (expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_70._8_8_;
          }
          uVar6 = uVar6 + 1;
          lVar3 = *(long *)stride_bytes;
        } while (uVar6 < (ulong)(*(long *)(stride_bytes + 8) - lVar3 >> 2));
        local_98._20_4_ = (undefined4)((ulong)local_98._16_8_ >> 0x20);
        local_98._28_4_ = (undefined4)((ulong)local_98._24_8_ >> 0x20);
      }
      (__return_storage_ptr__->contained).
      super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = true;
      *(undefined4 *)
       &(__return_storage_ptr__->contained).
        super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0 = local_98._16_4_;
      *(undefined4 *)
       ((long)&(__return_storage_ptr__->contained).
               super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0 + 4) = local_98._20_4_;
      *(undefined4 *)
       ((long)&(__return_storage_ptr__->contained).
               super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0 + 8) = local_98._24_4_;
      *(undefined4 *)
       ((long)&(__return_storage_ptr__->contained).
               super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0 + 0xc) = local_98._28_4_;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)peVar4;
      local_98._16_8_ = (long *)0x0;
      local_98._24_8_ = 0;
      local_78 = (expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x0;
      if ((expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_c8._0_8_ ==
          (expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x0) {
        return peVar4;
      }
      operator_delete((void *)local_c8._0_8_,local_b8._0_8_ - local_c8._0_8_);
      if ((long *)local_98._16_8_ == (long *)0x0) {
        return extraout_RAX_01;
      }
      uVar6 = (long)local_78 - local_98._16_8_;
      uVar7 = local_98._16_8_;
      goto LAB_00331077;
    }
    local_60._M_allocated_capacity = (size_type)local_50;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_70 + 0x10),
               "The number of input uniform attributes {} must be the same with faceVertexCounts.size() {}"
               ,"");
    local_38 = *(long *)(stride_bytes + 8) - *(long *)stride_bytes >> 2;
    fmt::format<unsigned_long,unsigned_long>
              ((string *)(local_b8 + 0x10),(fmt *)(local_70 + 0x10),(string *)local_70,&local_38,
               (unsigned_long *)faceVertexCounts);
  }
  else {
    local_60._M_allocated_capacity = (size_type)local_50;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_70 + 0x10),"input bytes {} must be the multiple of stride_bytes {}",
               "");
    local_70._0_8_ = *(long *)(this + 8) - *(long *)this;
    fmt::format<unsigned_long,unsigned_long>
              ((string *)(local_b8 + 0x10),(fmt *)(local_70 + 0x10),(string *)local_70,
               (unsigned_long *)&local_40,(unsigned_long *)faceVertexCounts);
  }
  uVar7 = local_b8._24_8_;
  local_c8._0_8_ = local_b8;
  if ((expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)local_b8._16_8_ ==
      (expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)local_98) {
    local_b8._8_8_ = local_98._8_8_;
    local_b8._16_8_ = local_c8._0_8_;
  }
  local_b8._1_7_ = local_98._1_7_;
  local_b8[0] = local_98[0];
  local_b8._24_8_ = (pointer)0x0;
  local_98[0] = false;
  (__return_storage_ptr__->contained).
  super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .m_has_value = false;
  ppuVar1 = &(__return_storage_ptr__->contained).
             super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->contained).
  super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)ppuVar1;
  if (local_b8._16_8_ == local_c8._0_8_) {
    *ppuVar1 = (pointer)local_b8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->contained).
             super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .field_0 + 0x18) = local_b8._8_8_;
  }
  else {
    (__return_storage_ptr__->contained).
    super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_b8._16_8_;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_b8._0_8_;
  }
  (__return_storage_ptr__->contained).
  super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)uVar7;
  local_c8._8_8_ = (pointer)0x0;
  local_b8._0_8_ = (ulong)(uint7)local_98._1_7_ << 8;
  if ((long *)local_60._M_allocated_capacity == local_50) {
    return (expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_c8._0_8_;
  }
  uVar6 = local_50[0] + 1;
  uVar7 = local_60._M_allocated_capacity;
  local_b8._16_8_ =
       (expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)local_98;
LAB_00331077:
  operator_delete((void *)uVar7,uVar6);
  return extraout_RAX_00;
}

Assistant:

nonstd::expected<std::vector<uint8_t>, std::string> UniformToFaceVarying(
    const std::vector<uint8_t> &src, const size_t stride_bytes,
    const std::vector<uint32_t> &faceVertexCounts) {
  std::vector<uint8_t> dst;

  if (stride_bytes == 0) {
    return nonstd::make_unexpected("stride_bytes is zero.");
  }

  if ((src.size() % stride_bytes) != 0) {
    return nonstd::make_unexpected(
        fmt::format("input bytes {} must be the multiple of stride_bytes {}",
                    src.size(), stride_bytes));
  }

  size_t num_uniforms = src.size() / stride_bytes;

  if (num_uniforms != faceVertexCounts.size()) {
    return nonstd::make_unexpected(fmt::format(
        "The number of input uniform attributes {} must be the same with "
        "faceVertexCounts.size() {}",
        num_uniforms, faceVertexCounts.size()));
  }

  std::vector<uint8_t> buf;
  buf.resize(stride_bytes);

  for (size_t i = 0; i < faceVertexCounts.size(); i++) {
    size_t cnt = faceVertexCounts[i];

    memcpy(buf.data(), src.data() + i * stride_bytes, stride_bytes);

    // repeat cnt times.
    for (size_t k = 0; k < cnt; k++) {
      dst.insert(dst.end(), buf.begin(), buf.end());
    }
  }

  return dst;
}